

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

TValue * cpparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  undefined4 *puVar1;
  int iVar2;
  char *pcVar3;
  GCstr *pGVar4;
  GCfunc *pGVar5;
  long in_RDX;
  int __c;
  long in_RDI;
  int bc;
  GCfunc *fn;
  GCproto *pt;
  LexState *ls;
  LexState *in_stack_000001e8;
  int in_stack_fffffffffffffedc;
  lua_State *in_stack_fffffffffffffee0;
  GCtab *in_stack_fffffffffffffef0;
  lua_State *L_00;
  undefined4 in_stack_fffffffffffffef8;
  LexState *in_stack_ffffffffffffff00;
  lua_State *in_stack_ffffffffffffff08;
  
  *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0x14) = 0xffffffff;
  iVar2 = lj_lex_setup(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  if (*(long *)(in_RDX + 0x78) != 0) {
    __c = 0x74;
    if (iVar2 != 0) {
      __c = 0x62;
    }
    pcVar3 = strchr(*(char **)(in_RDX + 0x78),__c);
    if (pcVar3 == (char *)0x0) {
      L_00 = *(lua_State **)(in_RDI + 0x18);
      *(MRef **)(in_RDI + 0x18) = &L_00->glref;
      pGVar4 = lj_err_str(L_00,(ErrMsg)((ulong)in_RDI >> 0x20));
      (L_00->nextgc).gcptr32 = (uint32_t)pGVar4;
      L_00->marked = 0xfb;
      L_00->gct = 0xff;
      L_00->dummy_ffid = 0xff;
      L_00->status = 0xff;
      lj_err_throw(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
  }
  if (iVar2 == 0) {
    lj_parse(in_stack_000001e8);
  }
  else {
    lj_bcread(in_stack_ffffffffffffff00);
  }
  pGVar5 = lj_func_newL_empty((lua_State *)in_stack_ffffffffffffff00,
                              (GCproto *)CONCAT44(iVar2,in_stack_fffffffffffffef8),
                              in_stack_fffffffffffffef0);
  puVar1 = *(undefined4 **)(in_RDI + 0x18);
  *(undefined4 **)(in_RDI + 0x18) = puVar1 + 2;
  *puVar1 = (int)pGVar5;
  puVar1[1] = 0xfffffff7;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  LexState *ls = (LexState *)ud;
  GCproto *pt;
  GCfunc *fn;
  int bc;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  bc = lj_lex_setup(L, ls);
  if (ls->mode && !strchr(ls->mode, bc ? 'b' : 't')) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_XMODE));
    lj_err_throw(L, LUA_ERRSYNTAX);
  }
  pt = bc ? lj_bcread(ls) : lj_parse(ls);
  fn = lj_func_newL_empty(L, pt, tabref(L->env));
  /* Don't combine above/below into one statement. */
  setfuncV(L, L->top++, fn);
  return NULL;
}